

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

void duckdb_destroy_result(duckdb_result *result)

{
  duckdb_column *__ptr;
  undefined8 *__ptr_00;
  bool *__ptr_01;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_> *this;
  idx_t i_1;
  undefined8 *puVar1;
  idx_t iVar2;
  idx_t i;
  ulong uVar3;
  idx_t iVar4;
  DuckDBResultData *result_data;
  bool bVar5;
  
  if (result->deprecated_columns != (duckdb_column *)0x0) {
    for (uVar3 = 0; __ptr = result->deprecated_columns, uVar3 < result->deprecated_column_count;
        uVar3 = uVar3 + 1) {
      __ptr_00 = (undefined8 *)__ptr[uVar3].deprecated_data;
      __ptr_01 = __ptr[uVar3].deprecated_nullmask;
      if (__ptr_00 != (undefined8 *)0x0) {
        iVar4 = result->deprecated_row_count;
        if (__ptr[uVar3].deprecated_type == DUCKDB_TYPE_VARCHAR) {
          for (iVar2 = 0; iVar4 != iVar2; iVar2 = iVar2 + 1) {
            free((void *)__ptr_00[iVar2]);
          }
        }
        else {
          puVar1 = __ptr_00;
          if (__ptr[uVar3].deprecated_type == DUCKDB_TYPE_BLOB) {
            while (bVar5 = iVar4 != 0, iVar4 = iVar4 - 1, bVar5) {
              free((void *)*puVar1);
              puVar1 = puVar1 + 2;
            }
          }
        }
        free(__ptr_00);
      }
      free(__ptr_01);
    }
    free(__ptr);
  }
  this = (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_> *)
         result->internal_data;
  if (this != (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_> *)0x0) {
    std::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>::~unique_ptr
              (this);
    operator_delete(this);
  }
  result->deprecated_error_message = (char *)0x0;
  result->internal_data = (void *)0x0;
  result->deprecated_rows_changed = 0;
  result->deprecated_columns = (duckdb_column *)0x0;
  result->deprecated_column_count = 0;
  result->deprecated_row_count = 0;
  return;
}

Assistant:

void duckdb_destroy_result(duckdb_result *result) {
	if (result->deprecated_columns) {
		for (idx_t i = 0; i < result->deprecated_column_count; i++) {
			DuckdbDestroyColumn(result->deprecated_columns[i], result->deprecated_row_count);
		}
		duckdb_free(result->deprecated_columns);
	}
	if (result->internal_data) {
		auto result_data = reinterpret_cast<duckdb::DuckDBResultData *>(result->internal_data);
		delete result_data;
	}
	memset(result, 0, sizeof(duckdb_result));
}